

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O1

int tnt_reply_hdr0(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  ushort *puVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  mp_type *pmVar8;
  char ********ppppppppcVar9;
  long lVar10;
  long extraout_RDX;
  size_t size_00;
  ulong uVar11;
  char ********ppppppppcVar12;
  char ********end;
  char **data;
  tnt_reply *r_00;
  char *pcVar13;
  int iVar14;
  ulong uVar15;
  char *unaff_R12;
  char *unaff_R13;
  char ********ppppppppcVar16;
  char ********ppppppppcStack_138;
  char *******pppppppcStack_130;
  char *******pppppppcStack_120;
  char *******pppppppcStack_118;
  ulong uStack_110;
  mp_type *pmStack_108;
  char ********ppppppppcStack_100;
  code *pcStack_f8;
  char ********ppppppppcStack_e8;
  mp_type *pmStack_e0;
  char ********ppppppppcStack_d8;
  char **ppcStack_d0;
  char ********ppppppppcStack_c8;
  char ********ppppppppcStack_c0;
  char ********ppppppppcStack_b8;
  char ********ppppppppcStack_b0;
  char ********ppppppppcStack_a8;
  char ********ppppppppcStack_a0;
  char ********ppppppppcStack_98;
  char ********ppppppppcStack_90;
  ulong uStack_88;
  char ********ppppppppcStack_80;
  size_t *psStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  tnt_reply *ptStack_58;
  code *apcStack_50 [2];
  char *local_40;
  char *test;
  
  data = &local_40;
  ppppppppcVar12 = (char ********)(buf + size);
  apcStack_50[0] = (code *)0x10a800;
  local_40 = buf;
  iVar6 = mp_check(data,(char *)ppppppppcVar12);
  if (iVar6 == 0) {
    bVar2 = *buf;
    pmVar8 = mp_type_hint;
    if (mp_type_hint[bVar2] != MP_MAP) {
      return -1;
    }
    if (bVar2 == 0xdf) {
      uVar7 = *(uint *)(buf + 1);
      uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
      ppppppppcVar12 = (char ********)(buf + 5);
    }
    else if (bVar2 == 0xde) {
      ppppppppcVar12 = (char ********)(buf + 3);
      uVar7 = (uint)(ushort)(*(ushort *)(buf + 1) << 8 | *(ushort *)(buf + 1) >> 8);
    }
    else {
      if (-0x71 < (char)bVar2) {
LAB_0010aaa1:
        apcStack_50[0] = (code *)0x10aaa6;
        tnt_reply_hdr0_cold_5();
LAB_0010aaa6:
        apcStack_50[0] = (code *)0x10aaab;
        tnt_reply_hdr0_cold_3();
LAB_0010aaab:
        apcStack_50[0] = (code *)0x10aab0;
        tnt_reply_hdr0_cold_2();
LAB_0010aab0:
        apcStack_50[0] = tnt_reply_body0;
        tnt_reply_hdr0_cold_1();
        end = (char ********)((long)ppppppppcVar12 + extraout_RDX);
        pcStack_f8 = (code *)0x10aae5;
        ppppppppcStack_e8 = ppppppppcVar12;
        ppppppppcStack_80 = ppppppppcVar12;
        psStack_78 = off;
        pcStack_70 = unaff_R12;
        pcStack_68 = unaff_R13;
        pcStack_60 = buf;
        ptStack_58 = r;
        apcStack_50[0] = (code *)&stack0xfffffffffffffff8;
        iVar6 = mp_check((char **)&ppppppppcStack_e8,(char *)end);
        r_00 = (tnt_reply *)0xffffffff;
        if (iVar6 != 0) {
LAB_0010b028:
          return (int)r_00;
        }
        bVar2 = *(byte *)ppppppppcStack_80;
        uVar11 = (ulong)bVar2;
        if (mp_type_hint[uVar11] != MP_MAP) goto LAB_0010b028;
        ppppppppcVar9 = (char ********)((long)ppppppppcStack_80 + 1);
        pmStack_e0 = pmVar8;
        ppppppppcStack_d8 = ppppppppcVar12;
        ppcStack_d0 = data;
        if (bVar2 == 0xdf) {
          uVar7 = *(uint *)((long)ppppppppcStack_80 + 1);
          uVar11 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                          uVar7 << 0x18);
          ppppppppcStack_80 = (char ********)((long)ppppppppcStack_80 + 5);
        }
        else if (bVar2 == 0xde) {
          uVar11 = (ulong)(ushort)(*(ushort *)((long)ppppppppcStack_80 + 1) << 8 |
                                  *(ushort *)((long)ppppppppcStack_80 + 1) >> 8);
          ppppppppcStack_80 = (char ********)((long)ppppppppcStack_80 + 3);
        }
        else {
          ppppppppcStack_80 = ppppppppcVar9;
          if (-0x71 < (char)bVar2) {
LAB_0010b043:
            pcStack_f8 = tnt_reply;
            tnt_reply_body0_cold_3();
            uStack_110 = uVar11;
            pmStack_108 = pmVar8;
            ppppppppcStack_100 = ppppppppcVar12;
            pcStack_f8 = (code *)apcStack_50;
            iVar6 = tnt_reply_len((char *)end,size_00,(size_t *)&pppppppcStack_118);
            pppppppcStack_120 = pppppppcStack_118;
            if (iVar6 == 0) {
              if (r_00 == (tnt_reply *)0x0) {
                iVar6 = 0;
              }
              else {
                pppppppcStack_130 = (char *******)&pppppppcStack_120;
                pppppppcStack_120 = (char *******)0x0;
                ppppppppcStack_138 = end;
                iVar6 = tnt_reply_from(r_00,tnt_reply_cb,&ppppppppcStack_138);
              }
            }
            else {
              if (iVar6 != 1) {
                return -1;
              }
              iVar6 = 1;
            }
            if (ppppppppcVar9 != (char ********)0x0) {
              *ppppppppcVar9 = pppppppcStack_120;
            }
            return iVar6;
          }
          uVar11 = (ulong)(bVar2 & 0xf);
        }
        ppppppppcStack_98 = (char ********)0x0;
        ppppppppcStack_90 = (char ********)0x0;
        ppppppppcStack_b0 = (char ********)0x0;
        ppppppppcStack_c8 = (char ********)0x0;
        ppppppppcStack_a8 = (char ********)0x0;
        ppppppppcStack_c0 = (char ********)0x0;
        ppppppppcStack_a0 = (char ********)0x0;
        ppppppppcStack_b8 = (char ********)0x0;
        uVar15 = 0;
LAB_0010abba:
        r_00 = (tnt_reply *)0xffffffff;
        iVar6 = (int)uVar11;
        uVar11 = (ulong)(iVar6 - 1);
        if (iVar6 == 0) {
          if (ppcStack_d0 != (char **)0x0) {
            ppcStack_d0[7] = (char *)ppppppppcStack_98;
            ppcStack_d0[8] = (char *)ppppppppcStack_90;
            ppcStack_d0[9] = (char *)ppppppppcStack_b0;
            ppcStack_d0[10] = (char *)ppppppppcStack_c8;
            ppcStack_d0[0xb] = (char *)ppppppppcStack_a8;
            ppcStack_d0[0xc] = (char *)ppppppppcStack_c0;
            ppcStack_d0[0xd] = (char *)ppppppppcStack_a0;
            ppcStack_d0[0xe] = (char *)ppppppppcStack_b8;
            ppcStack_d0[1] = (char *)((ulong)ppcStack_d0[1] | uVar15);
          }
          r_00 = (tnt_reply *)0x0;
          if (pmStack_e0 != (mp_type *)0x0) {
            *(long *)pmStack_e0 = (long)ppppppppcStack_80 - (long)ppppppppcStack_d8;
          }
          goto LAB_0010b028;
        }
        bVar2 = *(byte *)ppppppppcStack_80;
        pmVar8 = (mp_type *)(ulong)bVar2;
        ppppppppcVar16 = (char ********)((long)ppppppppcStack_80 + 1);
        ppppppppcVar9 = (char ********)(ulong)(bVar2 - 0xcc);
        switch(ppppppppcVar9) {
        case (char ********)0x0:
          pmVar8 = (mp_type *)(ulong)*(byte *)((long)ppppppppcStack_80 + 1);
          ppppppppcStack_80 = (char ********)((long)ppppppppcStack_80 + 2);
          break;
        case (char ********)0x1:
          puVar1 = (ushort *)((long)ppppppppcStack_80 + 1);
          ppppppppcStack_80 = (char ********)((long)ppppppppcStack_80 + 3);
          pmVar8 = (mp_type *)(ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
          break;
        case (char ********)0x2:
          uVar7 = *(uint *)((long)ppppppppcStack_80 + 1);
          pmVar8 = (mp_type *)
                   (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                          uVar7 << 0x18);
          ppppppppcStack_80 = (char ********)((long)ppppppppcStack_80 + 5);
          break;
        case (char ********)0x3:
          uVar4 = *(ulong *)((long)ppppppppcStack_80 + 1);
          pmVar8 = (mp_type *)
                   (uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                    (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                    (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                    (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38);
          ppppppppcStack_80 = (char ********)((long)ppppppppcStack_80 + 9);
          break;
        default:
          ppppppppcStack_80 = ppppppppcVar16;
          if (-1 < (char)bVar2) break;
          pcStack_f8 = (code *)0x10b03e;
          tnt_reply_body0_cold_2();
          goto LAB_0010b03e;
        }
        ppppppppcVar9 = ppppppppcStack_80;
        iVar6 = (int)pmVar8;
        if (iVar6 < 0x32) {
          if (iVar6 == 0x30) {
            if (mp_type_hint[*(byte *)ppppppppcStack_80] == MP_ARRAY) {
              ppppppppcVar12 = (char ********)0x1;
              do {
                end = (char ********)((long)ppppppppcStack_80 + 1);
                cVar3 = ""[*(byte *)ppppppppcStack_80];
                lVar10 = (long)cVar3;
                if (lVar10 < 0) {
                  if (*(byte *)ppppppppcStack_80 == 0xd9) {
                    ppppppppcStack_80 =
                         (char ********)
                         ((long)ppppppppcStack_80 +
                         (ulong)*(byte *)((long)ppppppppcStack_80 + 1) + 2);
                    goto LAB_0010ae20;
                  }
                  uStack_88 = uVar15;
                  if (cVar3 < -0x1f) {
                    pcStack_f8 = (code *)0x10ae71;
                    end = ppppppppcVar12;
                    mp_next_slowpath((char **)&ppppppppcStack_80,(int64_t)ppppppppcVar12);
                  }
                  else {
                    ppppppppcVar12 = (char ********)((long)ppppppppcVar12 - lVar10);
                    ppppppppcStack_80 = end;
                  }
                  bVar5 = cVar3 >= -0x1f;
                  uVar15 = uStack_88;
                }
                else {
                  end = (char ********)((long)end + lVar10);
                  ppppppppcStack_80 = end;
LAB_0010ae20:
                  bVar5 = true;
                }
              } while ((bVar5) &&
                      (bVar5 = 1 < (long)ppppppppcVar12,
                      ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + -1), bVar5));
              ppppppppcStack_c8 = ppppppppcStack_80;
              ppppppppcStack_b0 = ppppppppcVar9;
              goto LAB_0010afac;
            }
LAB_0010af36:
            bVar5 = false;
            goto LAB_0010afb2;
          }
          if (iVar6 == 0x31) {
            bVar2 = *(byte *)ppppppppcStack_80;
            ppppppppcVar9 = ppppppppcVar12;
            if (mp_type_hint[bVar2] != MP_STR) goto LAB_0010af36;
            ppppppppcVar16 = (char ********)((long)ppppppppcStack_80 + 1);
            if (bVar2 == 0xdb) {
              uVar7 = *(uint *)((long)ppppppppcStack_80 + 1);
              uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                      uVar7 << 0x18;
              ppppppppcStack_80 = (char ********)((long)ppppppppcStack_80 + 5);
            }
            else if (bVar2 == 0xda) {
              puVar1 = (ushort *)((long)ppppppppcStack_80 + 1);
              ppppppppcStack_80 = (char ********)((long)ppppppppcStack_80 + 3);
              uVar7 = (uint)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
            }
            else if (bVar2 == 0xd9) {
              uVar7 = (uint)*(byte *)((long)ppppppppcStack_80 + 1);
              ppppppppcStack_80 = (char ********)((long)ppppppppcStack_80 + 2);
            }
            else {
              ppppppppcVar9 = (char ********)(ulong)(bVar2 + 0x40);
              ppppppppcStack_80 = ppppppppcVar16;
              if ((byte)(bVar2 + 0x40) < 0xe0) {
LAB_0010b03e:
                pcStack_f8 = (code *)0x10b043;
                tnt_reply_body0_cold_1();
                goto LAB_0010b043;
              }
              uVar7 = bVar2 & 0x1f;
            }
            ppppppppcStack_98 = ppppppppcStack_80;
            ppppppppcStack_90 = (char ********)((ulong)uVar7 + (long)ppppppppcStack_80);
            ppppppppcVar9 = ppppppppcVar12;
            ppppppppcStack_80 = ppppppppcStack_90;
            goto LAB_0010afac;
          }
LAB_0010ad4f:
          ppppppppcVar16 = (char ********)0x1;
          ppppppppcVar9 = ppppppppcVar12;
          do {
            end = (char ********)((long)ppppppppcStack_80 + 1);
            cVar3 = ""[*(byte *)ppppppppcStack_80];
            lVar10 = (long)cVar3;
            if (lVar10 < 0) {
              if (*(byte *)ppppppppcStack_80 == 0xd9) {
                ppppppppcStack_80 =
                     (char ********)
                     ((long)ppppppppcStack_80 + (ulong)*(byte *)((long)ppppppppcStack_80 + 1) + 2);
                goto LAB_0010ad75;
              }
              uStack_88 = uVar15;
              if (cVar3 < -0x1f) {
                pcStack_f8 = (code *)0x10adc9;
                end = ppppppppcVar16;
                mp_next_slowpath((char **)&ppppppppcStack_80,(int64_t)ppppppppcVar16);
                ppppppppcVar9 = (char ********)&ppppppppcStack_80;
              }
              else {
                ppppppppcVar16 = (char ********)((long)ppppppppcVar16 - lVar10);
                ppppppppcStack_80 = end;
              }
              bVar5 = cVar3 >= -0x1f;
              uVar15 = uStack_88;
            }
            else {
              end = (char ********)((long)end + lVar10);
              ppppppppcStack_80 = end;
LAB_0010ad75:
              bVar5 = true;
            }
          } while ((bVar5) &&
                  (bVar5 = 1 < (long)ppppppppcVar16,
                  ppppppppcVar16 = (char ********)((long)ppppppppcVar16 + -1), bVar5));
        }
        else if (iVar6 == 0x32) {
          if (mp_type_hint[*(byte *)ppppppppcStack_80] != MP_ARRAY) goto LAB_0010af36;
          ppppppppcVar12 = (char ********)0x1;
          do {
            end = (char ********)((long)ppppppppcStack_80 + 1);
            cVar3 = ""[*(byte *)ppppppppcStack_80];
            lVar10 = (long)cVar3;
            if (lVar10 < 0) {
              if (*(byte *)ppppppppcStack_80 == 0xd9) {
                ppppppppcStack_80 =
                     (char ********)
                     ((long)ppppppppcStack_80 + (ulong)*(byte *)((long)ppppppppcStack_80 + 1) + 2);
                goto LAB_0010aec9;
              }
              uStack_88 = uVar15;
              if (cVar3 < -0x1f) {
                pcStack_f8 = (code *)0x10af17;
                end = ppppppppcVar12;
                mp_next_slowpath((char **)&ppppppppcStack_80,(int64_t)ppppppppcVar12);
              }
              else {
                ppppppppcVar12 = (char ********)((long)ppppppppcVar12 - lVar10);
                ppppppppcStack_80 = end;
              }
              bVar5 = cVar3 >= -0x1f;
              uVar15 = uStack_88;
            }
            else {
              end = (char ********)((long)end + lVar10);
              ppppppppcStack_80 = end;
LAB_0010aec9:
              bVar5 = true;
            }
          } while ((bVar5) &&
                  (bVar5 = 1 < (long)ppppppppcVar12,
                  ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + -1), bVar5));
          ppppppppcStack_c0 = ppppppppcStack_80;
          ppppppppcStack_a8 = ppppppppcVar9;
        }
        else {
          if (iVar6 != 0x42) goto LAB_0010ad4f;
          if (mp_type_hint[*(byte *)ppppppppcStack_80] != MP_MAP) goto LAB_0010af36;
          ppppppppcVar12 = (char ********)0x1;
          do {
            end = (char ********)((long)ppppppppcStack_80 + 1);
            cVar3 = ""[*(byte *)ppppppppcStack_80];
            lVar10 = (long)cVar3;
            if (lVar10 < 0) {
              if (*(byte *)ppppppppcStack_80 == 0xd9) {
                ppppppppcStack_80 =
                     (char ********)
                     ((long)ppppppppcStack_80 + (ulong)*(byte *)((long)ppppppppcStack_80 + 1) + 2);
                goto LAB_0010acdf;
              }
              uStack_88 = uVar15;
              if (cVar3 < -0x1f) {
                pcStack_f8 = (code *)0x10ad30;
                end = ppppppppcVar12;
                mp_next_slowpath((char **)&ppppppppcStack_80,(int64_t)ppppppppcVar12);
              }
              else {
                ppppppppcVar12 = (char ********)((long)ppppppppcVar12 - lVar10);
                ppppppppcStack_80 = end;
              }
              bVar5 = cVar3 >= -0x1f;
              uVar15 = uStack_88;
            }
            else {
              end = (char ********)((long)end + lVar10);
              ppppppppcStack_80 = end;
LAB_0010acdf:
              bVar5 = true;
            }
          } while ((bVar5) &&
                  (bVar5 = 1 < (long)ppppppppcVar12,
                  ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + -1), bVar5));
          ppppppppcStack_b8 = ppppppppcStack_80;
          ppppppppcStack_a0 = ppppppppcVar9;
        }
LAB_0010afac:
        uVar15 = uVar15 | 1L << ((ulong)pmVar8 & 0x3f);
        bVar5 = true;
LAB_0010afb2:
        r_00 = (tnt_reply *)0xffffffff;
        ppppppppcVar12 = ppppppppcVar9;
        if (!bVar5) goto LAB_0010b028;
        goto LAB_0010abba;
      }
      ppppppppcVar12 = (char ********)(buf + 1);
      uVar7 = bVar2 & 0xf;
    }
    iVar6 = uVar7 + 1;
    test = (char *)0x0;
    unaff_R13 = (char *)0x0;
    pcVar13 = (char *)0x0;
    data = (char **)0x0;
    do {
      iVar6 = iVar6 + -1;
      if (iVar6 == 0) {
        if (r != (tnt_reply *)0x0) {
          r->sync = (uint64_t)test;
          r->code = (ulong)((uint)unaff_R13 & 0x7fff);
          r->schema_id = (uint64_t)pcVar13;
          r->bitmap = (uint64_t)data;
        }
        if (off == (size_t *)0x0) {
          return 0;
        }
        *off = (long)ppppppppcVar12 - (long)buf;
        return 0;
      }
      bVar2 = *(byte *)ppppppppcVar12;
      uVar11 = (ulong)bVar2;
      if (mp_type_hint[uVar11] != MP_UINT) {
        return -1;
      }
      unaff_R12 = (char *)(ulong)(bVar2 - 0xcc);
      switch(unaff_R12) {
      case (char *)0x0:
        uVar11 = (ulong)*(byte *)((long)ppppppppcVar12 + 1);
        ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 2);
        break;
      case (char *)0x1:
        puVar1 = (ushort *)((long)ppppppppcVar12 + 1);
        ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 3);
        uVar11 = (ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
        break;
      case (char *)0x2:
        uVar7 = *(uint *)((long)ppppppppcVar12 + 1);
        uVar11 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                        uVar7 << 0x18);
        ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 5);
        break;
      case (char *)0x3:
        uVar11 = *(ulong *)((long)ppppppppcVar12 + 1);
        uVar11 = uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 |
                 (uVar11 & 0xff0000000000) >> 0x18 | (uVar11 & 0xff00000000) >> 8;
        ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 9);
        break;
      default:
        if ((char)bVar2 < '\0') {
          apcStack_50[0] = (code *)0x10aaa1;
          tnt_reply_hdr0_cold_4();
          goto LAB_0010aaa1;
        }
        ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 1);
      }
      bVar2 = *(byte *)ppppppppcVar12;
      unaff_R12 = (char *)(ulong)bVar2;
      if (mp_type_hint[(long)unaff_R12] == MP_UINT) {
        iVar14 = (int)uVar11;
        if (iVar14 == 0) {
          unaff_R13 = (char *)(ulong)(bVar2 - 0xcc);
          switch(unaff_R13) {
          case (char *)0x0:
            unaff_R13 = (char *)(ulong)*(byte *)((long)ppppppppcVar12 + 1);
LAB_0010a992:
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 2);
            break;
          case (char *)0x1:
            puVar1 = (ushort *)((long)ppppppppcVar12 + 1);
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 3);
            unaff_R13 = (char *)(ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
            break;
          case (char *)0x2:
            uVar7 = *(uint *)((long)ppppppppcVar12 + 1);
            unaff_R13 = (char *)(ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                        (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
LAB_0010a9c1:
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 5);
            break;
          case (char *)0x3:
            uVar15 = *(ulong *)((long)ppppppppcVar12 + 1);
            unaff_R13 = (char *)(uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                                 (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                                 (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                                 (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38);
LAB_0010a9f2:
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 9);
            break;
          default:
            if ((char)bVar2 < '\0') goto LAB_0010aaab;
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 1);
            unaff_R13 = unaff_R12;
          }
        }
        else if (iVar14 == 5) {
          switch(bVar2) {
          case 0xcc:
            pcVar13 = (char *)(ulong)*(byte *)((long)ppppppppcVar12 + 1);
            goto LAB_0010a992;
          case 0xcd:
            puVar1 = (ushort *)((long)ppppppppcVar12 + 1);
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 3);
            pcVar13 = (char *)(ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
            break;
          case 0xce:
            uVar7 = *(uint *)((long)ppppppppcVar12 + 1);
            pcVar13 = (char *)(ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 |
                                      (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
            goto LAB_0010a9c1;
          case 0xcf:
            uVar15 = *(ulong *)((long)ppppppppcVar12 + 1);
            pcVar13 = (char *)(uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                               (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                               (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                               (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38);
            goto LAB_0010a9f2;
          default:
            if ((char)bVar2 < '\0') goto LAB_0010aab0;
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 1);
            pcVar13 = unaff_R12;
          }
        }
        else {
          if (iVar14 != 1) goto LAB_0010a938;
          switch(bVar2) {
          case 0xcc:
            test = (char *)(ulong)*(byte *)((long)ppppppppcVar12 + 1);
            goto LAB_0010a992;
          case 0xcd:
            puVar1 = (ushort *)((long)ppppppppcVar12 + 1);
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 3);
            test = (char *)(ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
            break;
          case 0xce:
            uVar7 = *(uint *)((long)ppppppppcVar12 + 1);
            test = (char *)(ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                                  uVar7 << 0x18);
            goto LAB_0010a9c1;
          case 0xcf:
            uVar15 = *(ulong *)((long)ppppppppcVar12 + 1);
            test = (char *)(uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 |
                            (uVar15 & 0xff0000000000) >> 0x18 | (uVar15 & 0xff00000000) >> 8 |
                            (uVar15 & 0xff000000) << 8 | (uVar15 & 0xff0000) << 0x18 |
                            (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38);
            goto LAB_0010a9f2;
          default:
            if ((char)bVar2 < '\0') goto LAB_0010aaa6;
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + 1);
            test = unaff_R12;
          }
        }
        data = (char **)((ulong)data | 1L << (uVar11 & 0x3f));
        bVar5 = true;
      }
      else {
LAB_0010a938:
        bVar5 = false;
      }
    } while (bVar5);
  }
  return -1;
}

Assistant:

int
tnt_reply_hdr0(struct tnt_reply *r, const char *buf, size_t size, size_t *off) {
	const char *test = buf;
	const char *p = buf;
	if (mp_check(&test, p + size))
		return -1;
	if (mp_typeof(*p) != MP_MAP)
		return -1;

	uint32_t n = mp_decode_map(&p);
	uint64_t sync = 0, code = 0, schema_id = 0, bitmap = 0;
	while (n-- > 0) {
		if (mp_typeof(*p) != MP_UINT)
			return -1;
		uint32_t key = mp_decode_uint(&p);
		if (mp_typeof(*p) != MP_UINT)
			return -1;
		switch (key) {
		case TNT_SYNC:
			sync = mp_decode_uint(&p);
			break;
		case TNT_CODE:
			code = mp_decode_uint(&p);
			break;
		case TNT_SCHEMA_ID:
			schema_id = mp_decode_uint(&p);
			break;
		default:
			return -1;
		}
		bitmap |= (1ULL << key);
	}
	if (r) {
		r->sync = sync;
		r->code = code & ((1 << 15) - 1);
		r->schema_id = schema_id;
		r->bitmap = bitmap;
	}
	if (off)
		*off = p - buf;
	return 0;
}